

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groupnorm.cpp
# Opt level: O3

int __thiscall ncnn::GroupNorm::forward_inplace(GroupNorm *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  ulong uVar4;
  size_t sVar5;
  void *pvVar6;
  void *pvVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  int i_1;
  uint uVar14;
  int i;
  long lVar16;
  ulong uVar17;
  float *ptr;
  long lVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  float fVar24;
  ulong uVar15;
  
  iVar1 = this->group;
  if (0 < (long)iVar1) {
    iVar2 = this->affine;
    uVar17 = (long)this->channels / (long)iVar1;
    uVar10 = uVar17 & 0xffffffff;
    uVar14 = bottom_top_blob->w * bottom_top_blob->h;
    uVar15 = (ulong)uVar14;
    pvVar3 = bottom_top_blob->data;
    uVar4 = bottom_top_blob->elemsize;
    sVar5 = bottom_top_blob->cstep;
    uVar12 = (long)bottom_top_blob->d * uVar4 * (long)bottom_top_blob->h * (long)bottom_top_blob->w
             + 0xf & 0xfffffffffffffff0;
    lVar18 = 0;
    iVar9 = (int)uVar17;
    lVar13 = uVar12 - uVar12 % uVar4;
    fVar19 = 1.0 / (float)(int)(iVar9 * uVar14);
    do {
      if (0 < iVar9) {
        lVar11 = sVar5 * uVar4 * lVar18 * iVar9;
        fVar20 = 0.0;
        uVar17 = 0;
        do {
          if (0 < (int)uVar14) {
            lVar16 = 0;
            uVar12 = uVar15;
            do {
              fVar20 = fVar20 + *(float *)((long)pvVar3 + lVar16 * 4 + lVar13 * uVar17 + lVar11);
              lVar16 = lVar16 + 1;
              uVar12 = uVar12 - 1;
            } while (uVar12 != 0);
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 != uVar10);
        if (0 < iVar9) {
          fVar20 = fVar20 * fVar19;
          fVar21 = 0.0;
          uVar17 = 0;
          do {
            if (0 < (int)uVar14) {
              lVar16 = 0;
              uVar12 = uVar15;
              do {
                fVar22 = *(float *)((long)pvVar3 + lVar16 * 4 + lVar13 * uVar17 + lVar11) - fVar20;
                fVar21 = fVar21 + fVar22 * fVar22;
                lVar16 = lVar16 + 1;
                uVar12 = uVar12 - 1;
              } while (uVar12 != 0);
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 != uVar10);
          if (0 < iVar9) {
            fVar21 = fVar21 * fVar19;
            pvVar6 = (this->gamma_data).data;
            pvVar7 = (this->beta_data).data;
            uVar17 = 0;
            do {
              if (iVar2 == 0) {
                fVar24 = this->eps + fVar21;
                auVar23 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar24));
                fVar22 = auVar23._0_4_;
                fVar22 = fVar22 * -0.5 * (fVar24 * fVar22 * fVar22 + -3.0);
                fVar24 = fVar22 * -fVar20;
              }
              else {
                lVar16 = (lVar18 * iVar9 & 0xffffffffU) + uVar17;
                fVar24 = this->eps + fVar21;
                auVar23 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar24));
                fVar22 = auVar23._0_4_;
                fVar22 = fVar22 * -0.5 * (fVar24 * fVar22 * fVar22 + -3.0) *
                         *(float *)((long)pvVar6 + lVar16 * 4);
                fVar24 = *(float *)((long)pvVar7 + lVar16 * 4) - fVar22 * fVar20;
              }
              if (0 < (int)uVar14) {
                lVar16 = lVar13 * uVar17 + lVar11;
                lVar8 = 0;
                uVar12 = uVar15;
                do {
                  *(float *)((long)pvVar3 + lVar8 * 4 + lVar16) =
                       *(float *)((long)pvVar3 + lVar8 * 4 + lVar16) * fVar22 + fVar24;
                  lVar8 = lVar8 + 1;
                  uVar12 = uVar12 - 1;
                } while (uVar12 != 0);
              }
              uVar17 = uVar17 + 1;
            } while (uVar17 != uVar10);
          }
        }
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 != iVar1);
  }
  return 0;
}

Assistant:

int GroupNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // x = (x - mean) / sqrt(var + eps) * gamma + beta

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int size = w * h;

    int channels_per_group = channels / group;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat bottom_top_blob_g = bottom_top_blob.channel_range(g * channels_per_group, channels_per_group);

        // mean and var
        float sum = 0.f;
        for (int q = 0; q < channels_per_group; q++)
        {
            const float* ptr = bottom_top_blob_g.channel(q);
            for (int i = 0; i < size; i++)
            {
                sum += ptr[i];
            }
        }
        float mean = sum / (channels_per_group * size);

        float sqsum = 0.f;
        for (int q = 0; q < channels_per_group; q++)
        {
            const float* ptr = bottom_top_blob_g.channel(q);
            for (int i = 0; i < size; i++)
            {
                float tmp = ptr[i] - mean;
                sqsum += tmp * tmp;
            }
        }
        float var = sqsum / (channels_per_group * size);

        for (int q = 0; q < channels_per_group; q++)
        {
            float a;
            float b;
            if (affine)
            {
                float gamma = gamma_data[g * channels_per_group + q];
                float beta = beta_data[g * channels_per_group + q];

                a = static_cast<float>(gamma / sqrt(var + eps));
                b = -mean * a + beta;
            }
            else
            {
                a = static_cast<float>(1.f / (sqrt(var + eps)));
                b = -mean * a;
            }

            float* ptr = bottom_top_blob_g.channel(q);

            for (int i = 0; i < size; i++)
            {
                ptr[i] = ptr[i] * a + b;
            }
        }
    }

    return 0;
}